

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

uint tree_sitter_gdscript_external_scanner_serialize(void *payload,char *buffer)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong __n;
  
  uVar1 = **(uint **)((long)payload + 8);
  uVar2 = 0xff;
  if (uVar1 < 0xff) {
    uVar2 = uVar1;
  }
  __n = (ulong)uVar2;
  *buffer = (char)uVar2;
  if (uVar1 != 0) {
    memcpy(buffer + 1,*(void **)(*(long *)((long)payload + 8) + 8),__n);
  }
  for (uVar3 = 1; (uVar3 < **payload && ((__n + uVar3) - 1 < 0x3ff)); uVar3 = uVar3 + 1) {
    buffer[uVar3 + __n] = *(char *)(*(long *)(*payload + 2) + uVar3 * 2);
  }
  return (int)uVar3 + uVar2;
}

Assistant:

unsigned tree_sitter_gdscript_external_scanner_serialize(void *payload,
                                                         char *buffer) {
    Scanner *scanner = (Scanner *)payload;

    size_t size = 0;

    size_t delimiter_count = scanner->delimiters->len;
    if (delimiter_count > UINT8_MAX) {
        delimiter_count = UINT8_MAX;
    }
    buffer[size++] = (char)delimiter_count;

    if (delimiter_count > 0) {
        memcpy(&buffer[size], scanner->delimiters->data, delimiter_count);
    }
    size += delimiter_count;

    for (int iter = 1; iter < scanner->indents->len &&
                       size < TREE_SITTER_SERIALIZATION_BUFFER_SIZE;
         ++iter) {
        buffer[size++] = (char)scanner->indents->data[iter];
    }

    return size;
}